

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O2

void __thiscall
TSMuxer::finishFileBlock
          (TSMuxer *this,int64_t newPts,int64_t newPCR,bool doChangeFile,bool recursive)

{
  uint8_t *puVar1;
  int local_2c;
  
  if (0 < this->m_processedBlockSize) {
    doFlush(this,newPCR,0x250);
    if (!doChangeFile) {
      local_2c = (int)(this->m_processedBlockSize / 0xc0);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((this->m_interleaveInfo).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,&local_2c);
    }
    this->m_processedBlockSize = 0;
    MuxerManager::muxBlockFinished((this->super_AbstractMuxer).m_owner,&this->super_AbstractMuxer);
    if (this->m_m2tsMode == true) {
      if ((this->m_outBuf != (uint8_t *)0x0) || (this->m_outBufLen != 0)) {
        __assert_fail("m_outBuf == nullptr && m_outBufLen == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/tsMuxer.cpp"
                      ,0x382,
                      "void TSMuxer::finishFileBlock(const int64_t, const int64_t, const bool, const bool)"
                     );
      }
    }
    else {
      flushTSBuffer(this);
    }
    puVar1 = (uint8_t *)operator_new__((long)this->m_writeBlockSize + 0x400);
    this->m_outBuf = puVar1;
    this->m_prevM2TSPCROffset = 0;
  }
  if (doChangeFile) {
    gotoNextFile(this,newPts);
  }
  writePATPMT(this,newPCR,true);
  writePCR(this,newPCR);
  if (recursive && this->m_sublingMuxer != (TSMuxer *)0x0) {
    finishFileBlock(this->m_sublingMuxer,newPts,newPCR,doChangeFile,false);
  }
  return;
}

Assistant:

void TSMuxer::finishFileBlock(const int64_t newPts, const int64_t newPCR, const bool doChangeFile, const bool recursive)
{
    if (m_processedBlockSize > 0)
    {
        constexpr auto gapForPATPMT = static_cast<int64_t>((192 * 4.0) / 35000000.0 * 27000000.0);
        doFlush(newPCR, gapForPATPMT);
        if (!doChangeFile)
            m_interleaveInfo.rbegin()->push_back(static_cast<int32_t>(m_processedBlockSize / 192));
        m_processedBlockSize = 0;
        m_owner->muxBlockFinished(this);
        if (m_m2tsMode)
            assert(m_outBuf == nullptr && m_outBufLen == 0);
        else
            flushTSBuffer();
        m_outBuf = new uint8_t[m_writeBlockSize + 1024];
        m_prevM2TSPCROffset = 0;
    }

    if (doChangeFile)
        gotoNextFile(newPts);

    writePATPMT(newPCR, true);
    writePCR(newPCR);

    if (m_sublingMuxer && recursive)
        m_sublingMuxer->finishFileBlock(newPts, newPCR, doChangeFile, false);
}